

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_descending_eig(REF_DBL *d)

{
  REF_DBL RVar1;
  int local_1c;
  REF_INT i;
  REF_DBL temp;
  REF_DBL *d_local;
  
  if (*d <= d[1] && d[1] != *d) {
    RVar1 = *d;
    *d = d[1];
    d[1] = RVar1;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      RVar1 = d[local_1c + 3];
      d[local_1c + 3] = d[local_1c + 6];
      d[local_1c + 6] = RVar1;
    }
  }
  if (*d <= d[2] && d[2] != *d) {
    RVar1 = *d;
    *d = d[2];
    d[2] = RVar1;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      RVar1 = d[local_1c + 3];
      d[local_1c + 3] = d[local_1c + 9];
      d[local_1c + 9] = RVar1;
    }
  }
  if (d[1] <= d[2] && d[2] != d[1]) {
    RVar1 = d[1];
    d[1] = d[2];
    d[2] = RVar1;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      RVar1 = d[local_1c + 6];
      d[local_1c + 6] = d[local_1c + 9];
      d[local_1c + 9] = RVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i;

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 1)) {
    temp = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  return REF_SUCCESS;
}